

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O2

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
::vine_swap(Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
            *this,Index columnIndex1,Index columnIndex2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  Index IVar10;
  invalid_argument *this_00;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  puVar4 = (this->super_type).pivotToPosition_.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)this[1].super_type.
                super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                .barcode_.
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (ulong)columnIndex1 * 0x30;
  lVar12 = (ulong)columnIndex2 * 0x30;
  uVar1 = puVar4[*(uint *)(lVar5 + 4 + lVar11)];
  uVar2 = puVar4[*(uint *)(lVar5 + 4 + lVar12)];
  iVar9 = uVar1 - uVar2;
  if (uVar1 < uVar2) {
    iVar9 = -(uVar1 - uVar2);
  }
  if (iVar9 == 1) {
    bVar6 = _is_negative_in_pair(this,columnIndex1);
    bVar7 = _is_negative_in_pair(this,columnIndex2);
    bVar8 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
            ::is_zero_entry((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                             *)&this[-1].deathComp_._M_invoker,columnIndex2,
                            *(ID_index *)
                             ((long)this[1].super_type.
                                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                                    .barcode_.
                                    super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 4 + lVar11));
    if (bVar6 && bVar7) {
      if (!bVar8) {
        IVar10 = _negative_vine_swap(this,columnIndex1,columnIndex2);
        return IVar10;
      }
      lVar5 = (long)this[1].super_type.
                    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                    .barcode_.
                    super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = *(uint *)(lVar5 + 4 + lVar11);
      uVar2 = *(uint *)(lVar5 + 4 + lVar12);
      Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
      ::negative_transpose(&this->super_type,uVar1,uVar2);
      puVar4 = (this->super_type).pivotToPosition_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = puVar4[uVar1];
      puVar4[uVar1] = puVar4[uVar2];
      puVar4[uVar2] = uVar3;
    }
    else {
      if (bVar6) {
        if (!bVar8) {
          IVar10 = _negative_positive_vine_swap(this,columnIndex1,columnIndex2);
          return IVar10;
        }
        lVar5 = (long)this[1].super_type.
                      super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                      .barcode_.
                      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        uVar1 = *(uint *)(lVar5 + 4 + lVar11);
        uVar14 = (ulong)uVar1;
        uVar2 = *(uint *)(lVar5 + 4 + lVar12);
        uVar13 = (ulong)uVar2;
        Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
        ::negative_positive_transpose(&this->super_type,uVar1,uVar2);
      }
      else if (bVar7) {
        if (!bVar8) {
          IVar10 = _positive_negative_vine_swap(this,columnIndex1,columnIndex2);
          return IVar10;
        }
        lVar5 = (long)this[1].super_type.
                      super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                      .barcode_.
                      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        uVar1 = *(uint *)(lVar5 + 4 + lVar11);
        uVar14 = (ulong)uVar1;
        uVar2 = *(uint *)(lVar5 + 4 + lVar12);
        uVar13 = (ulong)uVar2;
        Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
        ::positive_negative_transpose(&this->super_type,uVar1,uVar2);
      }
      else {
        if (!bVar8) {
          IVar10 = _positive_vine_swap(this,columnIndex1,columnIndex2);
          return IVar10;
        }
        lVar5 = (long)this[1].super_type.
                      super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
                      .barcode_.
                      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        uVar1 = *(uint *)(lVar5 + 4 + lVar11);
        uVar14 = (ulong)uVar1;
        uVar2 = *(uint *)(lVar5 + 4 + lVar12);
        uVar13 = (ulong)uVar2;
        Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false,_true>_>_>
        ::positive_transpose(&this->super_type,uVar1,uVar2);
      }
      puVar4 = (this->super_type).pivotToPosition_.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = puVar4[uVar14];
      puVar4[uVar14] = puVar4[uVar13];
      puVar4[uVar13] = uVar1;
    }
    return columnIndex1;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,
             "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the \'real\' matrix."
            );
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap(Index columnIndex1,
                                                                                                Index columnIndex2)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    GUDHI_CHECK(CP::are_adjacent(_matrix()->get_pivot(columnIndex1), _matrix()->get_pivot(columnIndex2)),
                std::invalid_argument(
                    "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the 'real' matrix."));
  }

  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (col1IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_positive_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_positive_vine_swap(columnIndex1, columnIndex2);
  }

  if (col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::positive_negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _positive_negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
      ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

      CP::positive_transpose(pivot1, pivot2);
      CP::swap_positions(pivot1, pivot2);
    }
    return columnIndex1;
  }
  return _positive_vine_swap(columnIndex1, columnIndex2);
}